

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawCmd *pIVar1;
  bool bVar2;
  int iVar3;
  ImDrawList *pIVar4;
  ImDrawCmd *pIVar5;
  ImDrawCmd *pIVar6;
  ImDrawVert *pIVar7;
  char *pcVar8;
  undefined8 in_RDX;
  ImDrawList *in_RSI;
  ImGuiWindow *in_RDI;
  ImDrawListFlags backup_flags;
  ImDrawVert *v;
  int n;
  ImVec2 triangles_pos [3];
  char *buf_end;
  char *buf_p;
  char buf [300];
  int vtx_i;
  int prim;
  ImGuiListClipper clipper;
  int i;
  ImRect vtxs_rect;
  ImRect clip_rect;
  bool pcmd_node_open;
  ImDrawIdx *idx_buffer;
  ImDrawCmd *pcmd;
  int elem_offset;
  ImDrawList *overlay_draw_list;
  bool node_open;
  float items_height;
  int in_stack_fffffffffffffd0c;
  float in_stack_fffffffffffffd10;
  float in_stack_fffffffffffffd14;
  ImGuiListClipper *in_stack_fffffffffffffd18;
  ImColor *in_stack_fffffffffffffd20;
  uint local_2bc;
  ImVec2 *local_2a0;
  uint local_294;
  unsigned_short *local_280;
  ImDrawList *in_stack_fffffffffffffd90;
  ImVec2 *in_stack_fffffffffffffd98;
  ImVec2 *in_stack_fffffffffffffda0;
  ImColor *this;
  ImDrawList *a;
  ImDrawList *this_00;
  ImDrawListFlags IVar9;
  int iVar10;
  ImVec2 IStack_200;
  uint *local_1f8;
  ImGuiListClipper *local_1f0;
  ImGuiListClipper local_1e8;
  ImVec2 *in_stack_fffffffffffffe38;
  ImGuiSelectableFlags in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  char *in_stack_fffffffffffffe48;
  uint local_bc;
  int local_b8;
  ImGuiListClipper local_a8;
  uint local_90;
  ImRect local_8c;
  ImRect local_7c;
  byte local_69;
  unsigned_short *local_68;
  ImDrawCmd *local_60;
  uint local_54;
  ImVec2 local_50;
  ImDrawList *local_48;
  ImColor local_3c;
  ImVec4 local_2c;
  byte local_19;
  ImDrawList *local_10;
  ImGuiWindow *local_8;
  
  if (in_RSI->_OwnerName == (char *)0x0) {
    this_00 = (ImDrawList *)0x2365a2;
  }
  else {
    this_00 = (ImDrawList *)in_RSI->_OwnerName;
  }
  items_height = (float)(in_RSI->CmdBuffer).Size;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_19 = TreeNode(in_RSI,"%s: \'%s\' %d vtx, %d indices, %d cmds",in_RDX,this_00,
                      (ulong)(uint)(in_RSI->VtxBuffer).Size,(ulong)(uint)(in_RSI->IdxBuffer).Size);
  a = local_10;
  pIVar4 = GetWindowDrawList();
  if (a == pIVar4) {
    SameLine(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10);
    this = &local_3c;
    ImColor::ImColor(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                     (int)in_stack_fffffffffffffd18,(int)in_stack_fffffffffffffd14,
                     (int)in_stack_fffffffffffffd10);
    local_2c = ImColor::operator_cast_to_ImVec4(this);
    TextColored(&local_2c,"CURRENTLY APPENDING");
    if ((local_19 & 1) != 0) {
      TreePop();
    }
  }
  else {
    local_48 = ::GetOverlayDrawList(local_8);
    if ((local_8 != (ImGuiWindow *)0x0) &&
       (bVar2 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffd10), bVar2)) {
      in_stack_fffffffffffffd98 = &local_8->Pos;
      in_stack_fffffffffffffd90 = local_48;
      local_50 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffd0c,items_height),
                           (ImVec2 *)0x153a29);
      ImDrawList::AddRect(this_00,(ImVec2 *)a,in_stack_fffffffffffffda0,
                          (ImU32)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                          SUB84(in_stack_fffffffffffffd98,0),
                          (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                          SUB84(in_stack_fffffffffffffd90,0));
    }
    if ((local_19 & 1) != 0) {
      local_54 = 0;
      for (local_60 = ImVector<ImDrawCmd>::begin(&local_10->CmdBuffer); pIVar6 = local_60,
          pIVar5 = ImVector<ImDrawCmd>::end(&local_10->CmdBuffer), pIVar1 = local_60,
          pIVar6 < pIVar5; local_60 = local_60 + 1) {
        if ((local_60->UserCallback != (ImDrawCallback)0x0) || (local_60->ElemCount != 0)) {
          if (local_60->UserCallback == (ImDrawCallback)0x0) {
            if ((local_10->IdxBuffer).Size < 1) {
              local_280 = (unsigned_short *)0x0;
            }
            else {
              local_280 = (local_10->IdxBuffer).Data;
            }
            local_68 = local_280;
            pIVar6 = ImVector<ImDrawCmd>::begin(&local_10->CmdBuffer);
            pcVar8 = "non-indexed";
            if (0 < (local_10->IdxBuffer).Size) {
              pcVar8 = "indexed";
            }
            local_69 = TreeNode((void *)(double)(local_60->ClipRect).x,
                                (char *)(double)(local_60->ClipRect).y,
                                (double)(local_60->ClipRect).z,(double)(local_60->ClipRect).w,
                                ((long)pIVar1 - (long)pIVar6) / 0x30,
                                "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                                (ulong)local_60->ElemCount,pcVar8,local_60->TextureId);
            if (((show_draw_cmd_clip_rects & 1U) != 0) &&
               (bVar2 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffd10), bVar2)) {
              ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)
                             ,(ImVec4 *)CONCAT44(in_stack_fffffffffffffd0c,items_height));
              ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)
                            );
              for (local_90 = local_54; (int)local_90 < (int)(local_54 + local_60->ElemCount);
                  local_90 = local_90 + 1) {
                if (local_68 == (unsigned_short *)0x0) {
                  local_294 = local_90;
                }
                else {
                  local_294 = (uint)local_68[(int)local_90];
                }
                pIVar7 = ImVector<ImDrawVert>::operator[](&local_10->VtxBuffer,local_294);
                ImRect::Add(&local_8c,&pIVar7->pos);
              }
              ImRect::Floor(&local_7c);
              ImDrawList::AddRect(this_00,(ImVec2 *)a,in_stack_fffffffffffffda0,
                                  (ImU32)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                                  SUB84(in_stack_fffffffffffffd98,0),
                                  (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                                  SUB84(in_stack_fffffffffffffd90,0));
              ImRect::Floor(&local_8c);
              ImDrawList::AddRect(this_00,(ImVec2 *)a,in_stack_fffffffffffffda0,
                                  (ImU32)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                                  SUB84(in_stack_fffffffffffffd98,0),
                                  (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                                  SUB84(in_stack_fffffffffffffd90,0));
            }
            if ((local_69 & 1) != 0) {
              ImGuiListClipper::ImGuiListClipper
                        ((ImGuiListClipper *)
                         CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                         in_stack_fffffffffffffd0c,items_height);
              while (bVar2 = ImGuiListClipper::Step(in_stack_fffffffffffffd18), bVar2) {
                local_bc = local_54 + local_a8.DisplayStart * 3;
                for (local_b8 = local_a8.DisplayStart; local_b8 < local_a8.DisplayEnd;
                    local_b8 = local_b8 + 1) {
                  local_1f0 = &local_1e8;
                  local_1f8 = &local_bc;
                  local_2a0 = (ImVec2 *)&stack0xfffffffffffffde8;
                  do {
                    ImVec2::ImVec2(local_2a0);
                    local_2a0 = local_2a0 + 1;
                  } while (local_2a0 != &IStack_200);
                  for (iVar10 = 0; iVar10 < 3; iVar10 = iVar10 + 1) {
                    if (local_68 == (unsigned_short *)0x0) {
                      local_2bc = local_bc;
                    }
                    else {
                      local_2bc = (uint)local_68[(int)local_bc];
                    }
                    pIVar7 = ImVector<ImDrawVert>::operator[](&local_10->VtxBuffer,local_2bc);
                    *(ImVec2 *)(&stack0xfffffffffffffde8 + (long)iVar10 * 8) = pIVar7->pos;
                    if (iVar10 == 0) {
                      pcVar8 = "vtx";
                    }
                    else {
                      pcVar8 = "   ";
                    }
                    iVar3 = ImFormatString((char *)(double)(pIVar7->pos).x,
                                           (size_t)(double)(pIVar7->pos).y,
                                           (char *)(double)(pIVar7->uv).x,(double)(pIVar7->uv).y,
                                           local_1f0,(long)((int)local_1f8 - (int)local_1f0),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           pcVar8,(ulong)local_bc,(ulong)pIVar7->col);
                    local_1f0 = (ImGuiListClipper *)((long)&local_1f0->StartPosY + (long)iVar3);
                    local_bc = local_bc + 1;
                  }
                  in_stack_fffffffffffffd18 = &local_1e8;
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdd0,0.0,0.0);
                  Selectable(in_stack_fffffffffffffe48,(bool)in_stack_fffffffffffffe47,
                             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                  bVar2 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffd10);
                  in_stack_fffffffffffffd14 =
                       (float)CONCAT13(bVar2,SUB43(in_stack_fffffffffffffd14,0));
                  if (bVar2) {
                    IVar9 = local_48->Flags;
                    local_48->Flags = local_48->Flags & 0xfffffffe;
                    ImDrawList::AddPolyline
                              (local_48,(ImVec2 *)&stack0xfffffffffffffde8,3,0xff00ffff,true,1.0);
                    local_48->Flags = IVar9;
                  }
                }
              }
              TreePop();
              ImGuiListClipper::~ImGuiListClipper(&local_a8);
            }
          }
          else {
            BulletText("Callback %p, user_data %p",local_60->UserCallback,local_60->UserCallbackData
                      );
          }
        }
        local_54 = local_60->ElemCount + local_54;
      }
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* overlay_draw_list = GetOverlayDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, vtx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                            overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            overlay_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }